

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

int time_iseasterday(void)

{
  tm *ptVar1;
  int iVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long in_FS_OFFSET;
  time_t time_data;
  time_t time_data_now;
  long local_38;
  long local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  time(&local_30);
  ptVar1 = localtime(&local_30);
  iVar2 = ptVar1->tm_year + 0x76c;
  iVar10 = iVar2 >> 0x1f;
  iVar9 = iVar2 / 100 + iVar10;
  uVar7 = iVar9 - iVar10;
  cVar8 = (char)iVar2 + (char)uVar7 * -100;
  iVar5 = (int)((ulong)((long)iVar2 * -0x51eb851f) >> 0x20);
  uVar6 = (iVar9 - iVar10) + 3;
  if (-1 < (int)uVar7) {
    uVar6 = uVar7;
  }
  iVar10 = (int)((ulong)((long)((iVar9 - iVar10) + 8) * -0x51eb851f) >> 0x20);
  iVar10 = ((iVar10 >> 3) - (iVar10 >> 0x1f)) + uVar7 + 1;
  iVar10 = (int)((ulong)((long)iVar10 * 0x55555555) >> 0x20) - iVar10;
  iVar9 = (iVar10 >> 1) - (iVar10 >> 0x1f);
  iVar5 = ((iVar5 >> 7) - (iVar5 >> 0x1f)) + uVar7 + (iVar2 % 0x13) * 0x13;
  iVar10 = iVar5 + iVar9;
  iVar5 = (int)((ulong)((long)(iVar5 + iVar9 + 0xf) * -0x77777777) >> 0x20) + iVar10 + 0xf;
  iVar5 = ((iVar5 >> 4) - (iVar5 >> 0x1f)) * -0x1e + iVar10 + 0xf;
  iVar10 = (uint)(byte)(((cVar8 / '\x04') * '\x04' - cVar8) + 0x20) +
           ((int)((char)(((byte)(cVar8 >> 7) >> 6) + cVar8) >> 2) + (uVar7 - (uVar6 & 0x7ffffffc)))
           * 2;
  iVar9 = iVar10 - iVar5;
  iVar2 = (iVar9 % 7) * 0x16 + iVar5 * 0xb + iVar2 % 0x13;
  uVar6 = ((uint)((short)iVar2 * -0x6eaf) >> 0x10) + iVar2;
  uVar6 = (((int)(short)uVar6 >> 8) + ((uVar6 & 0xffff) >> 0xf)) * 0xf9 + iVar10 + (iVar9 / 7) * -7
          + 0x72;
  cVar8 = (char)((uVar6 & 0xff) * 9 >> 8);
  cVar3 = (char)uVar6;
  bVar4 = (byte)(((byte)(cVar3 - cVar8) >> 1) + cVar8) >> 4;
  lVar11 = -0x15180;
  while( true ) {
    local_38 = local_30 + lVar11;
    ptVar1 = localtime(&local_38);
    if ((ptVar1->tm_mon == bVar4 - 1) &&
       (ptVar1->tm_mday == (uint)(byte)(cVar3 + bVar4 * -0x1f + 1))) break;
    lVar11 = lVar11 + 0x15180;
    if (lVar11 == 0x3f480) {
      iVar10 = 0;
LAB_001432a3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return iVar10;
      }
      __stack_chk_fail();
    }
  }
  iVar10 = 1;
  goto LAB_001432a3;
}

Assistant:

int time_iseasterday()
{
	time_t time_data_now, time_data;
	struct tm *time_info;
	int Y, a, b, c, d, e, f, g, h, i, k, L, m, month, day, day_offset;

	time(&time_data_now);
	time_info = localtime(&time_data_now);

	// compute Easter day (Sunday) using https://en.wikipedia.org/w/index.php?title=Computus&oldid=890710285#Anonymous_Gregorian_algorithm
	Y = time_info->tm_year + 1900;
	a = Y % 19;
	b = Y / 100;
	c = Y % 100;
	d = b / 4;
	e = b % 4;
	f = (b + 8) / 25;
	g = (b - f + 1) / 3;
	h = (19 * a + b - d - g + 15) % 30;
	i = c / 4;
	k = c % 4;
	L = (32 + 2 * e + 2 * i - h - k) % 7;
	m = (a + 11 * h + 22 * L) / 451;
	month = (h + L - 7 * m + 114) / 31;
	day = ((h + L - 7 * m + 114) % 31) + 1;

	// (now-1d ≤ easter ≤ now+2d) <=> (easter-2d ≤ now ≤ easter+1d) <=> (Good Friday ≤ now ≤ Easter Monday)
	for(day_offset = -1; day_offset <= 2; day_offset++)
	{
		time_data = time_data_now + day_offset*(60*60*24);
		time_info = localtime(&time_data);

		if(time_info->tm_mon == month-1 && time_info->tm_mday == day)
			return 1;
	}
	return 0;
}